

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_socket.cpp
# Opt level: O0

ssize_t __thiscall net::TcpSocket::read_n(TcpSocket *this,void *msg,size_t buf_len)

{
  ssize_t sVar1;
  ssize_t a_recv_size;
  ssize_t recv_size;
  size_t buf_len_local;
  void *msg_local;
  TcpSocket *this_local;
  
  if (msg == (void *)0x0) {
    __assert_fail("msg != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/distanceNing[P]benchmarkTool/socket/tcp_socket.cpp"
                  ,0x74,"ssize_t net::TcpSocket::read_n(void *, size_t)");
  }
  a_recv_size = 0;
  do {
    sVar1 = read(this->fd_,(void *)((long)msg + a_recv_size),buf_len - a_recv_size);
    if (sVar1 < 1) {
      return a_recv_size;
    }
    a_recv_size = sVar1 + a_recv_size;
  } while (a_recv_size != buf_len);
  return a_recv_size;
}

Assistant:

ssize_t TcpSocket::read_n(void* msg, size_t buf_len)
{
    assert(msg != NULL);
    ssize_t recv_size = 0;
    ssize_t a_recv_size;
    while ((a_recv_size = ::read(fd_, (char*) msg + recv_size, buf_len - recv_size)) > 0) {
        recv_size += a_recv_size;
        if ( recv_size == buf_len )
            break;
    }
    return recv_size;
}